

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

int __thiscall
table::select_abi_cxx11_
          (table *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  column *pcVar3;
  pointer pcVar4;
  bool bVar5;
  ostream *poVar6;
  long *plVar7;
  undefined4 in_register_00000034;
  long lVar8;
  undefined8 *puVar9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  cols;
  string colName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  local_78;
  undefined8 *local_58;
  string local_50;
  
  lVar8 = CONCAT44(in_register_00000034,__nfds);
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar9 = *(undefined8 **)__readfds->fds_bits[4];
  local_58 = (undefined8 *)((undefined8 *)__readfds->fds_bits[4])[1];
  if (((long)local_58 - (long)puVar9 == 8) && (*(int *)*puVar9 == 3)) {
    plVar7 = *(long **)(lVar8 + 8);
    plVar2 = *(long **)(lVar8 + 0x10);
    if (plVar7 != plVar2) {
      paVar1 = &local_a0.first.field_2;
      do {
        pcVar3 = (column *)*plVar7;
        pcVar4 = (pcVar3->name)._M_dataplus._M_p;
        local_a0.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar4,pcVar4 + (pcVar3->name)._M_string_length);
        local_a0.second = pcVar3;
        std::
        vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
        ::emplace_back<std::pair<std::__cxx11::string,column*>>
                  ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                    *)&local_78,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first._M_dataplus._M_p);
        }
        plVar7 = plVar7 + 1;
      } while (plVar7 != plVar2);
    }
  }
  else if (puVar9 != local_58) {
    paVar1 = &local_a0.first.field_2;
    do {
      if ((*(uint *)*puVar9 | 4) == 5) {
        std::__cxx11::string::string
                  ((string *)&local_50,*(char **)((uint *)*puVar9 + 10),(allocator *)&local_a0);
        plVar2 = *(long **)(lVar8 + 0x10);
        for (plVar7 = *(long **)(lVar8 + 8); plVar7 != plVar2; plVar7 = plVar7 + 1) {
          pcVar3 = (column *)*plVar7;
          bVar5 = util::compareString(&pcVar3->name,&local_50);
          if (bVar5) {
            if (pcVar3 != (column *)0x0) {
              pcVar4 = (pcVar3->name)._M_dataplus._M_p;
              local_a0.first._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,pcVar4,pcVar4 + (pcVar3->name)._M_string_length);
              local_a0.second = pcVar3;
              std::
              vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
              ::emplace_back<std::pair<std::__cxx11::string,column*>>
                        ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                          *)&local_78,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0.first._M_dataplus._M_p != paVar1) {
                operator_delete(local_a0.first._M_dataplus._M_p);
              }
              bVar5 = false;
              goto LAB_00119630;
            }
            break;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column \'",8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\' does not exist in table ",0x1a);
        local_a0.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*(long *)(lVar8 + 0x28),
                   *(long *)(lVar8 + 0x30) + *(long *)(lVar8 + 0x28));
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_a0.first._M_dataplus._M_p,local_a0.first._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.first._M_dataplus._M_p);
        }
        this->_vptr_table = (_func_int **)0x0;
        (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar5 = true;
LAB_00119630:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar5) goto LAB_00119681;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_58);
  }
  this->_vptr_table =
       (_func_int **)
       local_78.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00119681:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::~vector(&local_78);
  return (int)this;
}

Assistant:

vector<pair<string, column*>> table::select(hsql::SelectStatement *stmt){

    vector<pair<string, column*>> cols;

    if(stmt->selectList->size() == 1 && (*stmt->selectList)[0]->type == hsql::kExprStar) {    // select *
        for (auto col : table_cols)
            cols.push_back(make_pair(col->name, col));
    }
    else{
        for(hsql::Expr* expr : *stmt->selectList){

            if(expr->type == hsql::kExprLiteralString || expr->type == hsql::kExprColumnRef){   // select C1,C2,...
                string colName = expr->name;
                column *col = getColumn(colName);
                if(col == NULL){
                    cout <<"Column '"<<colName<<"' does not exist in table "<<getabsName()<<endl;
                    return {};
                }else{
                    cols.push_back(make_pair(col->name, col));
                }
            }//else if(expr->type == hsql::kExprLiteralInt){
            //    cols.push_back(make_pair(to_string(expr->ival), (column*)NULL));
            //}
        }
    }
    return cols;

}